

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O3

int Fl::handle_(int e,Fl_Window *window)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  Fl_Widget *pFVar4;
  char cVar5;
  int iVar6;
  Fl_Window *pFVar7;
  Fl_Window *pFVar8;
  handler_link *phVar9;
  Fl_Window *this;
  
  pFVar4 = belowmouse_;
  e_number = e;
  if (fl_local_grab != (_func_int_int *)0x0) {
    iVar6 = (*fl_local_grab)(e);
    return iVar6;
  }
  pFVar7 = window;
  switch(e) {
  case 1:
    pFVar7 = grab_;
    if ((grab_ == (Fl_Window *)0x0) &&
       (pFVar7 = window, modal_ != (Fl_Window *)0x0 && modal_ != window)) {
      return 0;
    }
    pushed_ = (Fl_Widget *)pFVar7;
    Fl_Tooltip::current((Fl_Widget *)pFVar7);
    iVar6 = send_event(1,(Fl_Widget *)pFVar7,window);
    if (iVar6 == 0) {
      (*(window->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(window);
      return 1;
    }
    return 1;
  case 2:
    pFVar7 = grab_;
    if ((grab_ == (Fl_Window *)0x0) && (pFVar7 = (Fl_Window *)pushed_, pushed_ == (Fl_Widget *)0x0))
    {
      pFVar7 = window;
      if (modal_ != window && modal_ != (Fl_Window *)0x0) {
        return 0;
      }
    }
    else {
      pushed_ = (Fl_Widget *)0x0;
    }
    iVar6 = send_event(2,(Fl_Widget *)pFVar7,window);
    fl_fix_focus();
    return iVar6;
  case 3:
    fl_xmousewin = window;
    fl_fix_focus();
    (*Fl_Tooltip::enter)(belowmouse_);
    return 1;
  case 4:
    if (pushed_ == (Fl_Widget *)0x0) {
      belowmouse((Fl_Widget *)0x0);
      (*Fl_Tooltip::enter)((Fl_Widget *)0x0);
    }
    if (fl_xmousewin == window) {
      fl_xmousewin = (Fl_Window *)0x0;
      fl_fix_focus();
      return 1;
    }
    return 1;
  case 5:
  case 0xb:
    if (pushed_ == (Fl_Widget *)0x0) {
      pFVar7 = grab_;
      if ((grab_ == (Fl_Window *)0x0) &&
         (pFVar7 = window,
         window == (Fl_Window *)0x0 || modal_ != window && modal_ != (Fl_Window *)0x0)) {
        fl_xmousewin = window;
        return 0;
      }
      fl_xmousewin = window;
      iVar6 = send_event(e,(Fl_Widget *)pFVar7,window);
      if (pFVar4 != belowmouse_) {
        (*Fl_Tooltip::enter)(belowmouse_);
        return (uint)(iVar6 != 0);
      }
      return (uint)(iVar6 != 0);
    }
    pFVar7 = (Fl_Window *)pushed_;
    if (grab_ != (Fl_Window *)0x0) {
      pFVar7 = grab_;
    }
    e_number = 5;
    e = 5;
    fl_xmousewin = window;
    goto LAB_001a4041;
  case 6:
    goto switchD_001a3c5a_caseD_6;
  case 7:
    window = (Fl_Window *)0x0;
switchD_001a3c5a_caseD_6:
    fl_xfocus = window;
    fl_fix_focus();
    return 1;
  case 8:
    (*Fl_Tooltip::enter)((Fl_Widget *)0x0);
    pFVar7 = grab_;
    fl_xfocus = window;
    if (grab_ == (Fl_Window *)0x0) {
      pFVar7 = (Fl_Window *)focus_;
    }
    for (; pFVar7 != (Fl_Window *)0x0;
        pFVar7 = (Fl_Window *)(pFVar7->super_Fl_Group).super_Fl_Widget.parent_) {
      iVar6 = send_event(8,(Fl_Widget *)pFVar7,window);
      if (iVar6 != 0) {
        return 1;
      }
    }
    if (e_dispatch == (Fl_Event_Dispatch)0x0) {
      iVar6 = handle_(0xc,window);
    }
    else {
      iVar6 = (*e_dispatch)(0xc,window);
    }
    pcVar3 = e_text;
    if (iVar6 != 0) {
      return 1;
    }
    bVar1 = *e_text;
    iVar6 = isalpha((uint)bVar1);
    if (iVar6 == 0) {
      return 0;
    }
    iVar6 = isupper((uint)bVar1);
    if (iVar6 == 0) {
      iVar6 = toupper((uint)bVar1);
      cVar5 = (char)iVar6;
    }
    else {
      iVar6 = tolower((uint)bVar1);
      cVar5 = (char)iVar6;
    }
    *pcVar3 = cVar5;
    e_number = 0xc;
  case 0xc:
    e = 0xc;
    pFVar7 = grab_;
    if (grab_ == (Fl_Window *)0x0) {
      if (belowmouse_ == (Fl_Widget *)0x0) {
LAB_001a40f8:
        this = modal_;
        if (modal_ == (Fl_Window *)0x0) {
          this = window;
        }
      }
      else {
        pFVar8 = (Fl_Window *)0x0;
        pFVar7 = (Fl_Window *)belowmouse_;
        do {
          uVar2 = (pFVar7->super_Fl_Group).super_Fl_Widget.flags_;
          this = pFVar8;
          if (pFVar8 == (Fl_Window *)0x0) {
            this = pFVar7;
          }
          pFVar8 = (Fl_Window *)0x0;
          if ((uVar2 & 1) == 0) {
            pFVar8 = this;
          }
          pFVar7 = (Fl_Window *)(pFVar7->super_Fl_Group).super_Fl_Widget.parent_;
        } while (pFVar7 != (Fl_Window *)0x0);
        if ((uVar2 & 1) != 0) goto LAB_001a40f8;
        pFVar7 = Fl_Widget::window((Fl_Widget *)this);
        if (Fl_X::first == (Fl_X *)0x0) {
          if (pFVar7 != (Fl_Window *)0x0) {
            pFVar8 = (Fl_Window *)0x0;
            goto LAB_001a4193;
          }
        }
        else {
          pFVar8 = Fl_X::first->w;
          if (pFVar7 != pFVar8) {
LAB_001a4193:
            iVar6 = send_event(0xc,(Fl_Widget *)pFVar8,pFVar8);
            if (iVar6 != 0) {
              return 1;
            }
          }
        }
      }
      for (; phVar9 = handlers, this != (Fl_Window *)0x0;
          this = (Fl_Window *)(this->super_Fl_Group).super_Fl_Widget.parent_) {
        pFVar7 = Fl_Widget::window((Fl_Widget *)this);
        iVar6 = send_event(0xc,(Fl_Widget *)this,pFVar7);
        if (iVar6 != 0) {
          return 1;
        }
      }
      for (; phVar9 != (handler_link *)0x0; phVar9 = phVar9->next) {
        iVar6 = (*phVar9->handle)(0xc);
        if (iVar6 != 0) {
          return 1;
        }
      }
      if (e_keysym != 0xff1b) {
        return 0;
      }
      if (modal_ != (Fl_Window *)0x0) {
        window = modal_;
      }
LAB_001a416d:
      Fl_Widget::do_callback
                ((Fl_Widget *)window,(Fl_Widget *)window,
                 (window->super_Fl_Group).super_Fl_Widget.user_data_);
      return 1;
    }
    goto LAB_001a4041;
  case 9:
    pFVar7 = grab_;
    if (grab_ == (Fl_Window *)0x0) {
      pFVar7 = (Fl_Window *)focus_;
    }
    while( true ) {
      if (pFVar7 == (Fl_Window *)0x0) {
        return 0;
      }
      iVar6 = send_event(9,(Fl_Widget *)pFVar7,window);
      if (iVar6 != 0) break;
      pFVar7 = (Fl_Window *)(pFVar7->super_Fl_Group).super_Fl_Widget.parent_;
    }
    return 1;
  case 10:
    if (grab_ != (Fl_Window *)0x0) {
      return 0;
    }
    if (modal_ != (Fl_Window *)0x0 && modal_ != window) {
      return 0;
    }
    goto LAB_001a416d;
  case 0xf:
    Fl_Widget::hide((Fl_Widget *)window);
    return 1;
  case 0x10:
    Fl_Widget::show((Fl_Widget *)window);
    return 1;
  case 0x13:
    fl_xfocus = window;
    if (((grab_ != (Fl_Window *)0x0) && (grab_ != window && grab_ != modal_)) &&
       (iVar6 = send_event(0x13,(Fl_Widget *)grab_,window), iVar6 != 0)) {
      return 1;
    }
    if (modal_ != (Fl_Window *)0x0) {
      send_event(0x13,(Fl_Widget *)modal_,window);
      return 1;
    }
    iVar6 = send_event(0x13,(Fl_Widget *)window,window);
    if (iVar6 != 0) {
      return 1;
    }
    break;
  case 0x14:
  case 0x15:
    dnd_flag = 1;
    break;
  case 0x16:
    dnd_flag = 1;
    belowmouse((Fl_Widget *)0x0);
    dnd_flag = 0;
    return 1;
  case 0x17:
    pFVar7 = (Fl_Window *)belowmouse_;
  }
  if (pFVar7 != (Fl_Window *)0x0) {
LAB_001a4041:
    iVar6 = send_event(e,(Fl_Widget *)pFVar7,window);
    if (iVar6 != 0) {
      dnd_flag = 0;
      return 1;
    }
  }
  dnd_flag = 0;
  phVar9 = handlers;
  if (handlers == (handler_link *)0x0) {
    dnd_flag = 0;
    return 0;
  }
  do {
    iVar6 = (*phVar9->handle)(e);
    if (iVar6 != 0) break;
    phVar9 = phVar9->next;
  } while (phVar9 != (handler_link *)0x0);
  return (uint)(iVar6 != 0);
}

Assistant:

int Fl::handle_(int e, Fl_Window* window)
{
  e_number = e;
  if (fl_local_grab) return fl_local_grab(e);

  Fl_Widget* wi = window;

  switch (e) {

  case FL_CLOSE:
    if ( grab() || (modal() && window != modal()) ) return 0;
    wi->do_callback();
    return 1;

  case FL_SHOW:
    wi->Fl_Widget::show(); // this calls Fl_Widget::show(), not Fl_Window::show()
    return 1;

  case FL_HIDE:
    wi->Fl_Widget::hide(); // this calls Fl_Widget::hide(), not Fl_Window::hide()
    return 1;

  case FL_PUSH:
#ifdef DEBUG
    printf("Fl::handle(e=%d, window=%p);\n", e, window);
#endif // DEBUG

    if (grab()) wi = grab();
    else if (modal() && wi != modal()) return 0;
    pushed_ = wi;
    Fl_Tooltip::current(wi);
    if (send_event(e, wi, window)) return 1;
    // raise windows that are clicked on:
    window->show();
    return 1;

  case FL_DND_ENTER:
  case FL_DND_DRAG:
    dnd_flag = 1;
    break;

  case FL_DND_LEAVE:
    dnd_flag = 1;
    belowmouse(0);
    dnd_flag = 0;
    return 1;

  case FL_DND_RELEASE:
    wi = belowmouse();
    break;

  case FL_MOVE:
  case FL_DRAG:
    fl_xmousewin = window; // this should already be set, but just in case.
    if (pushed()) {
      wi = pushed();
      if (grab()) wi = grab();
      e_number = e = FL_DRAG;
      break;
    }
    if (modal() && wi != modal()) wi = 0;
    if (grab()) wi = grab();
    { int ret;
      Fl_Widget* pbm = belowmouse();
#ifdef __APPLE__
      if (fl_mac_os_version < 100500) {
        // before 10.5, mouse moved events aren't sent to borderless windows such as tooltips
	Fl_Window *tooltip = Fl_Tooltip::current_window();
	int inside = 0;
	if (tooltip && tooltip->shown() ) { // check if a tooltip window is currently opened
	  // check if mouse is inside the tooltip
	  inside = (Fl::event_x_root() >= tooltip->x() && Fl::event_x_root() < tooltip->x() + tooltip->w() &&
	  Fl::event_y_root() >= tooltip->y() && Fl::event_y_root() < tooltip->y() + tooltip->h() );
	}
	// if inside, send event to tooltip window instead of background window
	if (inside) ret = send_event(e, tooltip, window);
	else ret = (wi && send_event(e, wi, window));
      } else
#endif
      ret = (wi && send_event(e, wi, window));
   if (pbm != belowmouse()) {
#ifdef DEBUG
      printf("Fl::handle(e=%d, window=%p);\n", e, window);
#endif // DEBUG
      Fl_Tooltip::enter(belowmouse());
    }
    return ret;}

  case FL_RELEASE: {
//    printf("FL_RELEASE: window=%p, pushed() = %p, grab() = %p, modal() = %p\n",
//           window, pushed(), grab(), modal());

    if (grab()) {
      wi = grab();
      pushed_ = 0; // must be zero before callback is done!
    } else if (pushed()) {
      wi = pushed();
      pushed_ = 0; // must be zero before callback is done!
    } else if (modal() && wi != modal()) return 0;
    int r = send_event(e, wi, window);
    fl_fix_focus();
    return r;}

  case FL_UNFOCUS:
    window = 0;
  case FL_FOCUS:
    fl_xfocus = window;
    fl_fix_focus();
    return 1;

  case FL_KEYUP:
    // Send the key-up to the current focus widget. This is not
    // always the same widget that received the corresponding
    // FL_KEYBOARD event because focus may have changed.
    // Sending the KEYUP to the right KEYDOWN is possible, but
    // would require that we track the KEYDOWN for every possible
    // key stroke (users may hold down multiple keys!) and then
    // make sure that the widget still exists before sending
    // a KEYUP there. I believe that the current solution is
    // "close enough".
    for (wi = grab() ? grab() : focus(); wi; wi = wi->parent())
      if (send_event(FL_KEYUP, wi, window)) return 1;
    return 0;

  case FL_KEYBOARD:
#ifdef DEBUG
    printf("Fl::handle(e=%d, window=%p);\n", e, window);
#endif // DEBUG

    Fl_Tooltip::enter((Fl_Widget*)0);

    fl_xfocus = window; // this should not happen!  But maybe it does:

    // Try it as keystroke, sending it to focus and all parents:
    for (wi = grab() ? grab() : focus(); wi; wi = wi->parent())
      if (send_event(FL_KEYBOARD, wi, window)) return 1;

    // recursive call to try shortcut:
    if (handle(FL_SHORTCUT, window)) return 1;

    // and then try a shortcut with the case of the text swapped, by
    // changing the text and falling through to FL_SHORTCUT case:
    {unsigned char* c = (unsigned char*)event_text(); // cast away const
    if (!isalpha(*c)) return 0;
    *c = isupper(*c) ? tolower(*c) : toupper(*c);}
    e_number = e = FL_SHORTCUT;

  case FL_SHORTCUT:
    if (grab()) {wi = grab(); break;} // send it to grab window

    // Try it as shortcut, sending to mouse widget and all parents:
    wi = find_active(belowmouse()); // STR #3216
    if (!wi) {
      wi = modal();
      if (!wi) wi = window;
    } else if (wi->window() != first_window()) {
      if (send_event(FL_SHORTCUT, first_window(), first_window())) return 1;
    }

    for (; wi; wi = wi->parent()) {
      if (send_event(FL_SHORTCUT, wi, wi->window())) return 1;
    }

    // try using add_handle() functions:
    if (send_handlers(FL_SHORTCUT)) return 1;

    // make Escape key close windows:
    if (event_key()==FL_Escape) {
      wi = modal(); if (!wi) wi = window;
      wi->do_callback();
      return 1;
    }

    return 0;

  case FL_ENTER:
#ifdef DEBUG
    printf("Fl::handle(e=%d, window=%p);\n", e, window);
#endif // DEBUG

    fl_xmousewin = window;
    fl_fix_focus();
    Fl_Tooltip::enter(belowmouse());
    return 1;

  case FL_LEAVE:
#ifdef DEBUG
    printf("Fl::handle(e=%d, window=%p);\n", e, window);
#endif // DEBUG

    if (!pushed_) {
      belowmouse(0);
      Fl_Tooltip::enter(0);
    }
    if (window == fl_xmousewin) {fl_xmousewin = 0; fl_fix_focus();}
    return 1;

  case FL_MOUSEWHEEL:
    fl_xfocus = window; // this should not happen!  But maybe it does:

    // Try sending it to the "grab" first
    if (grab() && grab()!=modal() && grab()!=window) {
      if (send_event(FL_MOUSEWHEEL, grab(), window)) return 1;
    }
    // Now try sending it to the "modal" window
    if (modal()) {
      send_event(FL_MOUSEWHEEL, modal(), window);
      return 1;
    }
    // Finally try sending it to the window, the event occured in
    if (send_event(FL_MOUSEWHEEL, window, window)) return 1;
  default:
    break;
  }
  if (wi && send_event(e, wi, window)) {
    dnd_flag = 0;
    return 1;
  }
  dnd_flag = 0;
  return send_handlers(e);
}